

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.h
# Opt level: O0

void __thiscall ser::Savepoint::Savepoint(Savepoint *this,Savepoint *other)

{
  Savepoint *other_local;
  Savepoint *this_local;
  
  std::__cxx11::string::string((string *)this);
  MetainfoSet::MetainfoSet(&this->metainfo_);
  operator=(this,other);
  return;
}

Assistant:

Savepoint(const Savepoint& other)
        {
            *this = other;
        }